

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

void __thiscall depspawn::internal::TaskPool::main(TaskPool *this)

{
  bool bVar1;
  long in_RDI;
  TaskPool *in_stack_ffffffffffffff70;
  TaskPool *in_stack_ffffffffffffff80;
  bool local_69;
  
  while (((*(byte *)(in_RDI + 0x208) ^ 0xff) & 1) != 0) {
    empty_queue(in_stack_ffffffffffffff70);
    LOCK();
    *(int *)(in_RDI + 0x20c) = *(int *)(in_RDI + 0x20c) + -1;
    UNLOCK();
    while( true ) {
      local_69 = false;
      if ((*(byte *)(in_RDI + 0x208) & 1) == 0) {
        local_69 = empty(in_stack_ffffffffffffff80);
      }
      if (local_69 == false) break;
      bVar1 = std::function::operator_cast_to_bool((function<void_()> *)in_stack_ffffffffffffff70);
      if (bVar1) {
        std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffff70);
      }
    }
    in_stack_ffffffffffffff80 = (TaskPool *)(in_RDI + 0x20c);
    LOCK();
    *(int *)&(in_stack_ffffffffffffff80->thread_pool_).threads_.
             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start =
         *(int *)&(in_stack_ffffffffffffff80->thread_pool_).threads_.
                  super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
    UNLOCK();
  }
  LOCK();
  *(int *)(in_RDI + 0x20c) = *(int *)(in_RDI + 0x20c) + -1;
  UNLOCK();
  return;
}

Assistant:

void main()
  {
    while (!finish_) {
      empty_queue();
      busy_threads_.fetch_sub(1);
      while(!finish_ && empty()) {
        if (idle_func_) {
          idle_func_();
        }
      }
      busy_threads_.fetch_add(1);
    }

    busy_threads_.fetch_sub(1);
  }